

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase *
CreateExtract(ExpressionEvalContext *ctx,ExprMemoryLiteral *memory,uint offset,TypeBase *type)

{
  SynBase *pSVar1;
  ExprBase *pEVar2;
  ExprPointerLiteral addr;
  ExprBase local_68;
  uchar *local_38;
  uchar *local_30;
  
  if (memory->ptr->end < memory->ptr->ptr + type->size) {
    __assert_fail("memory->ptr->ptr + type->size <= memory->ptr->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x1a9,
                  "ExprBase *CreateExtract(ExpressionEvalContext &, ExprMemoryLiteral *, unsigned int, TypeBase *)"
                 );
  }
  pSVar1 = (memory->super_ExprBase).source;
  local_68.type = &ExpressionContext::GetReferenceType(ctx->ctx,type)->super_TypeBase;
  local_38 = memory->ptr->ptr + offset;
  local_68.typeID = 0xc;
  local_68.next = (ExprBase *)0x0;
  local_68.listed = false;
  local_68._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248428;
  local_30 = local_38 + type->size;
  local_68.source = pSVar1;
  if (-1 < type->size) {
    pEVar2 = CreateLoad(ctx,&local_68);
    return pEVar2;
  }
  __assert_fail("ptr <= end",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                ,0x279,
                "ExprPointerLiteral::ExprPointerLiteral(SynBase *, TypeBase *, unsigned char *, unsigned char *)"
               );
}

Assistant:

ExprBase* CreateExtract(ExpressionEvalContext &ctx, ExprMemoryLiteral *memory, unsigned offset, TypeBase *type)
{
	assert(memory->ptr->ptr + type->size <= memory->ptr->end);

	ExprPointerLiteral addr(memory->source, ctx.ctx.GetReferenceType(type), memory->ptr->ptr + offset, memory->ptr->ptr + offset + type->size);

	return CreateLoad(ctx, &addr);
}